

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mfsInter.c
# Opt level: O0

Hop_Obj_t * Abc_NtkMfsInterplate(Mfs_Man_t *p,int *pCands,int nCands)

{
  ulong uVar1;
  int iVar2;
  int *piVar3;
  Kit_Graph_t *pGraph_00;
  int *pGloVars;
  int i;
  int c;
  int status;
  int nFanins;
  Hop_Obj_t *pFunc;
  Kit_Graph_t *pGraph;
  uint *puTruth;
  Sto_Man_t *pCnf;
  sat_solver *pSat;
  char FileName [32];
  int fDumpFile;
  int nCands_local;
  int *pCands_local;
  Mfs_Man_t *p_local;
  
  FileName[0x18] = '\0';
  FileName[0x19] = '\0';
  FileName[0x1a] = '\0';
  FileName[0x1b] = '\0';
  puTruth = (uint *)0x0;
  FileName._28_4_ = nCands;
  pCnf = (Sto_Man_t *)Abc_MfsCreateSolverResub(p,pCands,nCands,0);
  if (FileName._24_4_ != 0) {
    Abc_NtkMfsInterplate::Counter = Abc_NtkMfsInterplate::Counter + 1;
    sprintf((char *)&pSat,"cnf\\pj1_if6_mfs%03d.cnf");
    Sat_SolverWriteDimacs((sat_solver *)pCnf,(char *)&pSat,(lit *)0x0,(lit *)0x0,1);
  }
  iVar2 = sat_solver_solve((sat_solver *)pCnf,(lit *)0x0,(lit *)0x0,(long)p->pPars->nBTLimit,0,0,0);
  if (FileName._24_4_ != 0) {
    uVar1._0_4_ = pCnf[7].nClauses;
    uVar1._4_4_ = pCnf[7].nClausesA;
    printf("File %s has UNSAT problem with %d conflicts.\n",&pSat,uVar1 & 0xffffffff);
  }
  if (iVar2 == -1) {
    puTruth = (uint *)sat_solver_store_release((sat_solver *)pCnf);
    sat_solver_delete((sat_solver *)pCnf);
    piVar3 = Int_ManSetGlobalVars(p->pMan,FileName._28_4_);
    for (pGloVars._4_4_ = 0; pGloVars._4_4_ < (int)FileName._28_4_;
        pGloVars._4_4_ = pGloVars._4_4_ + 1) {
      iVar2 = lit_var(pCands[pGloVars._4_4_]);
      iVar2 = Vec_IntEntry(p->vProjVarsCnf,iVar2 + p->pCnf->nVars * -2);
      piVar3[pGloVars._4_4_] = iVar2;
    }
    iVar2 = Int_ManInterpolate(p->pMan,(Sto_Man_t *)puTruth,0,(uint **)&pGraph);
    Sto_ManFree((Sto_Man_t *)puTruth);
    if (iVar2 != FileName._28_4_) {
      __assert_fail("nFanins == nCands",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/mfs/mfsInter.c"
                    ,0x17f,"Hop_Obj_t *Abc_NtkMfsInterplate(Mfs_Man_t *, int *, int)");
    }
    pGraph_00 = Kit_TruthToGraph((uint *)pGraph,iVar2,p->vMem);
    p_local = (Mfs_Man_t *)Kit_GraphToHop((Hop_Man_t *)p->pNtk->pManFunc,pGraph_00);
    Kit_GraphFree(pGraph_00);
  }
  else {
    p->nTimeOuts = p->nTimeOuts + 1;
    p_local = (Mfs_Man_t *)0x0;
  }
  return (Hop_Obj_t *)p_local;
}

Assistant:

Hop_Obj_t * Abc_NtkMfsInterplate( Mfs_Man_t * p, int * pCands, int nCands )
{
    extern Hop_Obj_t * Kit_GraphToHop( Hop_Man_t * pMan, Kit_Graph_t * pGraph );
    int fDumpFile = 0;
    char FileName[32];
    sat_solver * pSat;
    Sto_Man_t * pCnf = NULL;
    unsigned * puTruth;
    Kit_Graph_t * pGraph;
    Hop_Obj_t * pFunc;
    int nFanins, status;
    int c, i, * pGloVars;
//    abctime clk = Abc_Clock();
//    p->nDcMints += Abc_NtkMfsInterplateEval( p, pCands, nCands );

    // derive the SAT solver for interpolation
    pSat = Abc_MfsCreateSolverResub( p, pCands, nCands, 0 );

    // dump CNF file (remember to uncomment two-lit clases in clause_create_new() in 'satSolver.c')
    if ( fDumpFile )
    {
        static int Counter = 0;
        sprintf( FileName, "cnf\\pj1_if6_mfs%03d.cnf", Counter++ );
        Sat_SolverWriteDimacs( pSat, FileName, NULL, NULL, 1 );
    }

    // solve the problem
    status = sat_solver_solve( pSat, NULL, NULL, (ABC_INT64_T)p->pPars->nBTLimit, (ABC_INT64_T)0, (ABC_INT64_T)0, (ABC_INT64_T)0 );
    if ( fDumpFile )
        printf( "File %s has UNSAT problem with %d conflicts.\n", FileName, (int)pSat->stats.conflicts );
    if ( status != l_False )
    {
        p->nTimeOuts++;
        return NULL;
    }
//printf( "%d\n", pSat->stats.conflicts );
//    ABC_PRT( "S", Abc_Clock() - clk );
    // get the learned clauses
    pCnf = (Sto_Man_t *)sat_solver_store_release( pSat );
    sat_solver_delete( pSat );

    // set the global variables
    pGloVars = Int_ManSetGlobalVars( p->pMan, nCands );
    for ( c = 0; c < nCands; c++ )
    {
        // get the variable number of this divisor
        i = lit_var( pCands[c] ) - 2 * p->pCnf->nVars;
        // get the corresponding SAT variable
        pGloVars[c] = Vec_IntEntry( p->vProjVarsCnf, i );
    }

    // derive the interpolant
    nFanins = Int_ManInterpolate( p->pMan, pCnf, 0, &puTruth );
    Sto_ManFree( pCnf );
    assert( nFanins == nCands );

    // transform interpolant into AIG
    pGraph = Kit_TruthToGraph( puTruth, nFanins, p->vMem );
    pFunc = Kit_GraphToHop( (Hop_Man_t *)p->pNtk->pManFunc, pGraph );
    Kit_GraphFree( pGraph );
    return pFunc;
}